

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O2

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::moldudp64_session
          (moldudp64_session<helix::parity::pmd_handler> *this,void *data)

{
  (this->super_session)._data = data;
  (this->super_session)._vptr_session = (_func_int **)&PTR__moldudp64_session_00125cf8;
  parity::pmd_handler::pmd_handler(&this->_handler);
  (this->_send_cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_send_cb)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_send_cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_send_cb).super__Function_base._M_functor + 8) = 0;
  this->_expected_seq_no = 1;
  this->_state = synchronized;
  (this->_sync_to_seq_no).super__Optional_base<unsigned_long,_false>._M_engaged = false;
  return;
}

Assistant:

moldudp64_session<Handler>::moldudp64_session(void* data)
    : session{data}
{
}